

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O0

void dr_prediction_z1_8xN_sse4_1
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined6 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined6 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  long in_RCX;
  long lVar12;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  uint in_R8D;
  int in_R9D;
  short sVar13;
  ushort uVar14;
  short sVar18;
  short sVar19;
  ulong uVar15;
  short sVar20;
  short sVar21;
  ushort uVar22;
  short sVar24;
  short sVar25;
  ulong uVar23;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  short sVar26;
  int i;
  int base_max_diff;
  int base;
  __m128i a1_above;
  __m128i a0_above;
  __m128i shift;
  __m128i res1;
  __m128i res;
  __m128i b;
  int r;
  int x;
  __m128i a_mbase_x;
  __m128i c3f;
  __m128i diff;
  __m128i a16;
  __m128i a32;
  __m128i a1;
  __m128i a0;
  int max_base_x;
  int frac_bits;
  int local_6ec;
  undefined8 local_6e8 [68];
  int local_4c4;
  int local_4c0;
  int local_4bc;
  undefined8 local_4b8;
  ulong uStack_4b0;
  undefined1 local_4a8 [16];
  ushort local_498;
  ushort uStack_496;
  ushort uStack_494;
  ushort uStack_492;
  ushort uStack_490;
  ushort uStack_48e;
  ushort uStack_48c;
  ushort uStack_48a;
  ushort local_488;
  ushort uStack_486;
  ushort uStack_484;
  ushort uStack_482;
  ushort uStack_480;
  ushort uStack_47e;
  ushort uStack_47c;
  ushort uStack_47a;
  char local_478;
  char cStack_477;
  char cStack_476;
  byte bStack_475;
  char cStack_474;
  byte bStack_473;
  char cStack_472;
  byte bStack_471;
  char cStack_470;
  char cStack_46f;
  char cStack_46e;
  byte bStack_46d;
  char cStack_46c;
  byte bStack_46b;
  char cStack_46a;
  byte bStack_469;
  short local_468;
  short sStack_466;
  short sStack_464;
  short sStack_462;
  short sStack_460;
  short sStack_45e;
  short sStack_45c;
  short sStack_45a;
  int local_450;
  int local_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  short local_428;
  short sStack_426;
  short sStack_424;
  short sStack_422;
  short sStack_420;
  short sStack_41e;
  short sStack_41c;
  short sStack_41a;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  int local_3d0;
  int local_3cc;
  byte local_3c4;
  undefined8 *local_3b8;
  undefined4 local_3a8;
  undefined2 local_3a2;
  undefined2 local_3a0;
  undefined2 local_39e;
  undefined2 local_39c;
  undefined1 local_399;
  undefined8 *local_398;
  undefined1 (*local_390) [16];
  uint8_t local_388 [8];
  uint8_t auStack_380 [8];
  undefined8 local_378;
  undefined8 uStack_370;
  undefined4 local_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined4 local_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined4 local_31c;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined4 local_2fc;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined4 local_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined4 local_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined2 local_a8;
  undefined2 local_a6;
  undefined2 local_a4;
  undefined2 local_a2;
  undefined2 local_a0;
  undefined2 local_9e;
  undefined2 local_9c;
  undefined2 local_9a;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined2 local_88;
  undefined2 local_86;
  undefined2 local_84;
  undefined2 local_82;
  undefined2 local_80;
  undefined2 local_7e;
  undefined2 local_7c;
  undefined2 local_7a;
  ulong uStack_78;
  int i_1;
  ulong uStack_70;
  undefined2 local_68;
  undefined2 local_66;
  undefined2 local_64;
  undefined2 local_62;
  undefined2 local_60;
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined2 local_48;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28 [3];
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  undefined1 local_20 [3];
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined8 *local_8;
  
  local_3a8 = 8;
  local_3b8 = local_6e8;
  local_3cc = 6 - in_R8D;
  local_3c4 = (byte)in_R8D;
  iVar11 = in_EDI + 7 << (local_3c4 & 0x1f);
  local_3d0 = iVar11;
  local_39c = 0x10;
  local_9a = 0x10;
  local_9c = 0x10;
  local_9e = 0x10;
  local_a0 = 0x10;
  local_a2 = 0x10;
  local_a4 = 0x10;
  local_a6 = 0x10;
  local_a8 = 0x10;
  local_b8 = 0x10001000100010;
  uStack_b0 = 0x10001000100010;
  local_418 = 0x10001000100010;
  uStack_410 = 0x10001000100010;
  local_399 = *(undefined1 *)(in_RCX + iVar11);
  local_19 = local_399;
  local_1a = local_399;
  local_1b = local_399;
  local_1c = local_399;
  local_1d = local_399;
  local_20 = (undefined1  [3])CONCAT21(CONCAT11(local_399,local_399),local_399);
  local_21 = local_399;
  local_22 = local_399;
  local_23 = local_399;
  local_24 = local_399;
  local_25 = local_399;
  local_28 = (undefined1  [3])CONCAT21(CONCAT11(local_399,local_399),local_399);
  uVar1 = CONCAT17(local_399,
                   CONCAT16(local_399,
                            CONCAT15(local_399,CONCAT14(local_399,CONCAT13(local_399,local_28)))));
  uVar2 = CONCAT17(local_399,
                   CONCAT16(local_399,
                            CONCAT15(local_399,CONCAT14(local_399,CONCAT13(local_399,local_20)))));
  local_38 = uVar1;
  uStack_30 = uVar2;
  local_448 = uVar1;
  uStack_440 = uVar2;
  local_39e = 0x3f;
  local_7a = 0x3f;
  local_7c = 0x3f;
  local_7e = 0x3f;
  local_80 = 0x3f;
  local_82 = 0x3f;
  local_84 = 0x3f;
  local_86 = 0x3f;
  local_88 = 0x3f;
  local_98 = 0x3f003f003f003f;
  uStack_90 = 0x3f003f003f003f;
  local_438 = 0x3f003f003f003f;
  uStack_430 = 0x3f003f003f003f;
  local_450 = 0;
  local_44c = in_R9D;
  while( true ) {
    if (in_EDI <= local_450) goto LAB_005437c6;
    local_4bc = local_44c >> ((byte)(6 - in_R8D) & 0x1f);
    local_4c0 = iVar11 - local_4bc >> (local_3c4 & 0x1f);
    if (local_4c0 < 1) break;
    if (8 < local_4c0) {
      local_4c0 = 8;
    }
    local_390 = (undefined1 (*) [16])(in_RCX + local_4bc);
    local_4a8 = *local_390;
    local_398 = (undefined8 *)(in_RCX + local_4bc + 1);
    local_4b8 = *local_398;
    uStack_4b0 = *(ulong *)(in_RCX + local_4bc + 9);
    if (in_R8D == 0) {
      local_3a0 = (undefined2)local_44c;
      local_5a = (undefined2)local_44c;
      local_5c = (undefined2)local_44c;
      local_5e = (undefined2)local_44c;
      local_60 = (undefined2)local_44c;
      local_62 = (undefined2)local_44c;
      local_64 = (undefined2)local_44c;
      local_66 = (undefined2)local_44c;
      local_68 = (undefined2)local_44c;
      uStack_78 = CONCAT26((undefined2)local_44c,
                           CONCAT24((undefined2)local_44c,
                                    CONCAT22((undefined2)local_44c,(undefined2)local_44c)));
      uStack_70 = CONCAT26((undefined2)local_44c,
                           CONCAT24((undefined2)local_44c,
                                    CONCAT22((undefined2)local_44c,(undefined2)local_44c)));
      local_2b8 = uStack_78;
      uStack_2b0 = uStack_70;
      local_2c8 = 0x3f003f003f003f;
      uStack_2c0 = 0x3f003f003f003f;
      uStack_78 = uStack_78 & 0x3f003f003f003f;
      uStack_70 = uStack_70 & 0x3f003f003f003f;
      local_2f8 = uStack_78;
      uStack_2f0 = uStack_70;
      local_2fc = 1;
      local_2f8._0_2_ = (ushort)uStack_78;
      local_2f8._2_2_ = (ushort)(uStack_78 >> 0x10);
      local_2f8._4_2_ = (ushort)(uStack_78 >> 0x20);
      uStack_2f0._0_2_ = (ushort)uStack_70;
      uStack_2f0._2_2_ = (ushort)(uStack_70 >> 0x10);
      uStack_2f0._4_2_ = (ushort)(uStack_70 >> 0x20);
      local_498 = (ushort)local_2f8 >> 1;
      uStack_496 = local_2f8._2_2_ >> 1;
      uStack_494 = local_2f8._4_2_ >> 1;
      uStack_492 = (ushort)(uStack_78 >> 0x31);
      uStack_490 = (ushort)uStack_2f0 >> 1;
      uStack_48e = uStack_2f0._2_2_ >> 1;
      uStack_48c = uStack_2f0._4_2_ >> 1;
      uStack_48a = (ushort)(uStack_70 >> 0x31);
    }
    else {
      local_378 = *(undefined8 *)*local_390;
      uStack_370 = *(undefined8 *)(*local_390 + 8);
      local_388 = (uint8_t  [8])EvenOddMaskx[0]._0_8_;
      auStack_380 = (uint8_t  [8])EvenOddMaskx[0]._8_8_;
      auVar16._8_8_ = EvenOddMaskx[0]._8_8_;
      auVar16._0_8_ = EvenOddMaskx[0]._0_8_;
      local_4a8 = pshufb(*local_390,auVar16);
      auVar16 = local_4a8;
      local_4b8 = local_4a8._8_8_;
      uStack_4b0 = 0;
      local_3a2 = (undefined2)local_44c;
      local_3a = (undefined2)local_44c;
      local_3c = (undefined2)local_44c;
      local_3e = (undefined2)local_44c;
      local_40 = (undefined2)local_44c;
      local_42 = (undefined2)local_44c;
      local_44 = (undefined2)local_44c;
      local_46 = (undefined2)local_44c;
      local_48 = (undefined2)local_44c;
      local_58 = CONCAT26((undefined2)local_44c,
                          CONCAT24((undefined2)local_44c,
                                   CONCAT22((undefined2)local_44c,(undefined2)local_44c)));
      uStack_50 = CONCAT26((undefined2)local_44c,
                           CONCAT24((undefined2)local_44c,
                                    CONCAT22((undefined2)local_44c,(undefined2)local_44c)));
      local_298 = local_58;
      uStack_290 = uStack_50;
      auVar17._8_8_ = uStack_50;
      auVar17._0_8_ = local_58;
      local_2d8 = psllw(auVar17,ZEXT416(in_R8D));
      local_2e8 = 0x3f003f003f003f;
      uStack_2e0 = 0x3f003f003f003f;
      uVar15 = local_2d8._0_8_ & 0x3f003f003f003f;
      uVar23 = local_2d8._8_8_ & 0x3f003f003f003f;
      local_358 = uVar15;
      uStack_350 = uVar23;
      local_35c = 1;
      local_358._0_2_ = (ushort)uVar15;
      local_358._2_2_ = (ushort)(uVar15 >> 0x10);
      local_358._4_2_ = (ushort)(uVar15 >> 0x20);
      uStack_350._0_2_ = (ushort)uVar23;
      uStack_350._2_2_ = (ushort)(uVar23 >> 0x10);
      uStack_350._4_2_ = (ushort)(uVar23 >> 0x20);
      local_498 = (ushort)local_358 >> 1;
      uStack_496 = local_358._2_2_ >> 1;
      uStack_494 = local_358._4_2_ >> 1;
      uStack_492 = (ushort)(uVar15 >> 0x31);
      uStack_490 = (ushort)uStack_350 >> 1;
      uStack_48e = uStack_350._2_2_ >> 1;
      uStack_48c = uStack_350._4_2_ >> 1;
      uStack_48a = (ushort)(uVar23 >> 0x31);
      local_4a8 = auVar16;
    }
    local_218 = local_4a8;
    local_218._0_8_ = local_4a8._0_8_;
    auVar16 = pmovzxbw(local_4a8,local_218._0_8_);
    local_228._8_8_ = uStack_4b0;
    local_228._0_8_ = local_4b8;
    auVar17 = pmovzxbw(local_228,local_4b8);
    local_3f8._0_8_ = auVar17._0_8_;
    local_3f8._8_8_ = auVar17._8_8_;
    local_3e8._0_8_ = auVar16._0_8_;
    local_3e8._8_8_ = auVar16._8_8_;
    local_1d8 = local_3f8._0_8_;
    uStack_1d0 = local_3f8._8_8_;
    local_1e8 = local_3e8._0_8_;
    uStack_1e0 = local_3e8._8_8_;
    local_1d8._0_2_ = auVar17._0_2_;
    local_1d8._2_2_ = auVar17._2_2_;
    local_1d8._4_2_ = auVar17._4_2_;
    local_1d8._6_2_ = auVar17._6_2_;
    uStack_1d0._0_2_ = auVar17._8_2_;
    uStack_1d0._2_2_ = auVar17._10_2_;
    uStack_1d0._4_2_ = auVar17._12_2_;
    uStack_1d0._6_2_ = auVar17._14_2_;
    local_1e8._0_2_ = auVar16._0_2_;
    local_1e8._2_2_ = auVar16._2_2_;
    local_1e8._4_2_ = auVar16._4_2_;
    local_1e8._6_2_ = auVar16._6_2_;
    uStack_1e0._0_2_ = auVar16._8_2_;
    uStack_1e0._2_2_ = auVar16._10_2_;
    uStack_1e0._4_2_ = auVar16._12_2_;
    uStack_1e0._6_2_ = auVar16._14_2_;
    local_258 = local_3e8._0_8_;
    uStack_250 = local_3e8._8_8_;
    local_25c = 5;
    auVar16 = psllw(auVar16,ZEXT416(5));
    local_408 = auVar16._0_8_;
    uStack_400 = auVar16._8_8_;
    local_158 = local_408;
    uStack_150 = uStack_400;
    local_168 = 0x10001000100010;
    uStack_160 = 0x10001000100010;
    local_158._0_2_ = auVar16._0_2_;
    local_158._2_2_ = auVar16._2_2_;
    local_158._4_2_ = auVar16._4_2_;
    local_158._6_2_ = auVar16._6_2_;
    uStack_150._0_2_ = auVar16._8_2_;
    uStack_150._2_2_ = auVar16._10_2_;
    uStack_150._4_2_ = auVar16._12_2_;
    uStack_150._6_2_ = auVar16._14_2_;
    local_408._0_4_ = CONCAT22(local_158._2_2_ + 0x10,(short)local_158 + 0x10);
    local_408._0_6_ = CONCAT24(local_158._4_2_ + 0x10,(undefined4)local_408);
    local_408 = CONCAT26(local_158._6_2_ + 0x10,(undefined6)local_408);
    uStack_400._0_2_ = (short)uStack_150 + 0x10;
    uStack_400._2_2_ = uStack_150._2_2_ + 0x10;
    uStack_400._4_2_ = uStack_150._4_2_ + 0x10;
    uStack_400._6_2_ = uStack_150._6_2_ + 0x10;
    local_118 = CONCAT26(local_1d8._6_2_ - local_1e8._6_2_,
                         CONCAT24(local_1d8._4_2_ - local_1e8._4_2_,
                                  CONCAT22(local_1d8._2_2_ - local_1e8._2_2_,
                                           (short)local_1d8 - (short)local_1e8)));
    uStack_110 = CONCAT26(uStack_1d0._6_2_ - uStack_1e0._6_2_,
                          CONCAT24(uStack_1d0._4_2_ - uStack_1e0._4_2_,
                                   CONCAT22(uStack_1d0._2_2_ - uStack_1e0._2_2_,
                                            (short)uStack_1d0 - (short)uStack_1e0)));
    local_128 = CONCAT26(uStack_492,CONCAT24(uStack_494,CONCAT22(uStack_496,local_498)));
    uStack_120 = CONCAT26(uStack_48a,CONCAT24(uStack_48c,CONCAT22(uStack_48e,uStack_490)));
    sVar13 = ((short)local_1d8 - (short)local_1e8) * local_498;
    sVar18 = (local_1d8._2_2_ - local_1e8._2_2_) * uStack_496;
    sVar19 = (local_1d8._4_2_ - local_1e8._4_2_) * uStack_494;
    sVar20 = (local_1d8._6_2_ - local_1e8._6_2_) * uStack_492;
    sVar21 = ((short)uStack_1d0 - (short)uStack_1e0) * uStack_490;
    sVar24 = (uStack_1d0._2_2_ - uStack_1e0._2_2_) * uStack_48e;
    sVar25 = (uStack_1d0._4_2_ - uStack_1e0._4_2_) * uStack_48c;
    sVar26 = (uStack_1d0._6_2_ - uStack_1e0._6_2_) * uStack_48a;
    local_178 = local_408;
    uStack_170 = uStack_400;
    local_188 = CONCAT26(sVar20,CONCAT24(sVar19,CONCAT22(sVar18,sVar13)));
    uStack_180 = CONCAT26(sVar26,CONCAT24(sVar25,CONCAT22(sVar24,sVar21)));
    uVar14 = (short)local_158 + 0x10 + sVar13;
    sVar18 = local_158._2_2_ + 0x10 + sVar18;
    sVar19 = local_158._4_2_ + 0x10 + sVar19;
    sVar20 = local_158._6_2_ + 0x10 + sVar20;
    uVar22 = (short)uStack_150 + 0x10 + sVar21;
    sVar24 = uStack_150._2_2_ + 0x10 + sVar24;
    sVar25 = uStack_150._4_2_ + 0x10 + sVar25;
    sVar26 = uStack_150._6_2_ + 0x10 + sVar26;
    cStack_476 = (char)sVar18;
    bStack_475 = (byte)((ushort)sVar18 >> 8);
    cStack_474 = (char)sVar19;
    bStack_473 = (byte)((ushort)sVar19 >> 8);
    cStack_472 = (char)sVar20;
    bStack_471 = (byte)((ushort)sVar20 >> 8);
    cStack_46e = (char)sVar24;
    bStack_46d = (byte)((ushort)sVar24 >> 8);
    cStack_46c = (char)sVar25;
    bStack_46b = (byte)((ushort)sVar25 >> 8);
    cStack_46a = (char)sVar26;
    bStack_469 = (byte)((ushort)sVar26 >> 8);
    uVar3 = CONCAT13(bStack_475,CONCAT12(cStack_476,uVar14));
    uVar4 = CONCAT15(bStack_473,CONCAT14(cStack_474,uVar3));
    local_318 = CONCAT17(bStack_471,CONCAT16(cStack_472,uVar4));
    uVar6 = CONCAT13(bStack_46d,CONCAT12(cStack_46e,uVar22));
    uVar7 = CONCAT15(bStack_46b,CONCAT14(cStack_46c,uVar6));
    uStack_310 = CONCAT17(bStack_469,CONCAT16(cStack_46a,uVar7));
    local_31c = 5;
    uVar14 = uVar14 >> 5;
    uVar22 = uVar22 >> 5;
    cStack_476 = (char)(ushort)((uint)uVar3 >> 0x15);
    bStack_475 = bStack_475 >> 5;
    cStack_474 = (char)(ushort)((uint6)uVar4 >> 0x25);
    bStack_473 = bStack_473 >> 5;
    cStack_472 = (char)(ushort)((ulong)local_318 >> 0x35);
    bStack_471 = bStack_471 >> 5;
    cStack_46e = (char)(ushort)((uint)uVar6 >> 0x15);
    bStack_46d = bStack_46d >> 5;
    cStack_46c = (char)(ushort)((uint6)uVar7 >> 0x25);
    bStack_46b = bStack_46b >> 5;
    cStack_46a = (char)(ushort)((ulong)uStack_310 >> 0x35);
    bStack_469 = bStack_469 >> 5;
    local_238 = local_4a8 >> 0x40;
    local_238._0_8_ = local_4a8._8_8_;
    local_3e8 = pmovzxbw(local_4a8 >> 0x40,local_238._0_8_);
    local_248._8_8_ = 0;
    local_248._0_8_ = uStack_4b0;
    local_3f8 = pmovzxbw(local_248,uStack_4b0);
    local_1f8 = local_3f8._0_8_;
    uStack_1f0 = local_3f8._8_8_;
    local_208 = local_3e8._0_8_;
    uStack_200 = local_3e8._8_8_;
    local_1f8._0_2_ = local_3f8._0_2_;
    local_1f8._2_2_ = local_3f8._2_2_;
    local_1f8._4_2_ = local_3f8._4_2_;
    local_1f8._6_2_ = local_3f8._6_2_;
    uStack_1f0._0_2_ = local_3f8._8_2_;
    uStack_1f0._2_2_ = local_3f8._10_2_;
    uStack_1f0._4_2_ = local_3f8._12_2_;
    uStack_1f0._6_2_ = local_3f8._14_2_;
    local_208._0_2_ = local_3e8._0_2_;
    local_208._2_2_ = local_3e8._2_2_;
    local_208._4_2_ = local_3e8._4_2_;
    local_208._6_2_ = local_3e8._6_2_;
    uStack_200._0_2_ = local_3e8._8_2_;
    uStack_200._2_2_ = local_3e8._10_2_;
    uStack_200._4_2_ = local_3e8._12_2_;
    uStack_200._6_2_ = local_3e8._14_2_;
    local_428 = (short)local_1f8 - (short)local_208;
    sStack_426 = local_1f8._2_2_ - local_208._2_2_;
    sStack_424 = local_1f8._4_2_ - local_208._4_2_;
    sStack_422 = local_1f8._6_2_ - local_208._6_2_;
    sStack_420 = (short)uStack_1f0 - (short)uStack_200;
    sStack_41e = uStack_1f0._2_2_ - uStack_200._2_2_;
    sStack_41c = uStack_1f0._4_2_ - uStack_200._4_2_;
    sStack_41a = uStack_1f0._6_2_ - uStack_200._6_2_;
    local_278 = local_3e8._0_8_;
    uStack_270 = local_3e8._8_8_;
    local_27c = 5;
    auVar16 = psllw(local_3e8,ZEXT416(5));
    local_408 = auVar16._0_8_;
    uStack_400 = auVar16._8_8_;
    local_198 = local_408;
    uStack_190 = uStack_400;
    local_1a8 = 0x10001000100010;
    uStack_1a0 = 0x10001000100010;
    local_198._0_2_ = auVar16._0_2_;
    local_198._2_2_ = auVar16._2_2_;
    local_198._4_2_ = auVar16._4_2_;
    local_198._6_2_ = auVar16._6_2_;
    uStack_190._0_2_ = auVar16._8_2_;
    uStack_190._2_2_ = auVar16._10_2_;
    uStack_190._4_2_ = auVar16._12_2_;
    uStack_190._6_2_ = auVar16._14_2_;
    local_408._0_4_ = CONCAT22(local_198._2_2_ + 0x10,(short)local_198 + 0x10);
    local_408._0_6_ = CONCAT24(local_198._4_2_ + 0x10,(undefined4)local_408);
    local_408 = CONCAT26(local_198._6_2_ + 0x10,(undefined6)local_408);
    uStack_400._0_2_ = (short)uStack_190 + 0x10;
    uStack_400._2_2_ = uStack_190._2_2_ + 0x10;
    uStack_400._4_2_ = uStack_190._4_2_ + 0x10;
    uStack_400._6_2_ = uStack_190._6_2_ + 0x10;
    local_138 = CONCAT26(sStack_422,CONCAT24(sStack_424,CONCAT22(sStack_426,local_428)));
    uStack_130 = CONCAT26(sStack_41a,CONCAT24(sStack_41c,CONCAT22(sStack_41e,sStack_420)));
    local_148 = CONCAT26(uStack_492,CONCAT24(uStack_494,CONCAT22(uStack_496,local_498)));
    uStack_140 = CONCAT26(uStack_48a,CONCAT24(uStack_48c,CONCAT22(uStack_48e,uStack_490)));
    local_468 = local_428 * local_498;
    sStack_466 = sStack_426 * uStack_496;
    sStack_464 = sStack_424 * uStack_494;
    sStack_462 = sStack_422 * uStack_492;
    sStack_460 = sStack_420 * uStack_490;
    sStack_45e = sStack_41e * uStack_48e;
    sStack_45c = sStack_41c * uStack_48c;
    sStack_45a = sStack_41a * uStack_48a;
    local_1b8 = local_408;
    uStack_1b0 = uStack_400;
    local_1c8 = CONCAT26(sStack_462,CONCAT24(sStack_464,CONCAT22(sStack_466,local_468)));
    uStack_1c0 = CONCAT26(sStack_45a,CONCAT24(sStack_45c,CONCAT22(sStack_45e,sStack_460)));
    local_488 = (short)local_198 + 0x10 + local_468;
    uStack_486 = local_198._2_2_ + 0x10 + sStack_466;
    uStack_484 = local_198._4_2_ + 0x10 + sStack_464;
    uStack_482 = local_198._6_2_ + 0x10 + sStack_462;
    uStack_480 = (short)uStack_190 + 0x10 + sStack_460;
    uStack_47e = uStack_190._2_2_ + 0x10 + sStack_45e;
    uStack_47c = uStack_190._4_2_ + 0x10 + sStack_45c;
    uStack_47a = uStack_190._6_2_ + 0x10 + sStack_45a;
    local_338 = CONCAT26(uStack_482,CONCAT24(uStack_484,CONCAT22(uStack_486,local_488)));
    uStack_330 = CONCAT26(uStack_47a,CONCAT24(uStack_47c,CONCAT22(uStack_47e,uStack_480)));
    local_33c = 5;
    local_488 = local_488 >> 5;
    uStack_486 = uStack_486 >> 5;
    uStack_484 = uStack_484 >> 5;
    uStack_482 = uStack_482 >> 5;
    uStack_480 = uStack_480 >> 5;
    uStack_47e = uStack_47e >> 5;
    uStack_47c = uStack_47c >> 5;
    uStack_47a = uStack_47a >> 5;
    uVar3 = CONCAT13(bStack_475,CONCAT12(cStack_476,uVar14));
    uVar4 = CONCAT15(bStack_473,CONCAT14(cStack_474,uVar3));
    uVar5 = CONCAT17(bStack_471,CONCAT16(cStack_472,uVar4));
    uVar6 = CONCAT13(bStack_46d,CONCAT12(cStack_46e,uVar22));
    uVar7 = CONCAT15(bStack_46b,CONCAT14(cStack_46c,uVar6));
    uVar8 = CONCAT17(bStack_469,CONCAT16(cStack_46a,uVar7));
    local_f8 = uVar5;
    uStack_f0 = uVar8;
    local_108 = CONCAT26(uStack_482,CONCAT24(uStack_484,CONCAT22(uStack_486,local_488)));
    uStack_100 = CONCAT26(uStack_47a,CONCAT24(uStack_47c,CONCAT22(uStack_47e,uStack_480)));
    local_f8._2_2_ = (ushort)((uint)uVar3 >> 0x10);
    local_f8._4_2_ = (ushort)((uint6)uVar4 >> 0x20);
    local_f8._6_2_ = (ushort)((ulong)uVar5 >> 0x30);
    uStack_f0._2_2_ = (ushort)((uint)uVar6 >> 0x10);
    uStack_f0._4_2_ = (ushort)((uint6)uVar7 >> 0x20);
    uStack_f0._6_2_ = (ushort)((ulong)uVar8 >> 0x30);
    local_478 = (uVar14 != 0) * (uVar14 < 0x100) * (char)uVar14 - (0xff < uVar14);
    cStack_477 = (local_f8._2_2_ != 0) * (local_f8._2_2_ < 0x100) * cStack_476 -
                 (0xff < local_f8._2_2_);
    cStack_476 = (local_f8._4_2_ != 0) * (local_f8._4_2_ < 0x100) * cStack_474 -
                 (0xff < local_f8._4_2_);
    bStack_475 = (local_f8._6_2_ != 0) * (local_f8._6_2_ < 0x100) * cStack_472 -
                 (0xff < local_f8._6_2_);
    cStack_474 = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
    bStack_473 = (uStack_f0._2_2_ != 0) * (uStack_f0._2_2_ < 0x100) * cStack_46e -
                 (0xff < uStack_f0._2_2_);
    cStack_472 = (uStack_f0._4_2_ != 0) * (uStack_f0._4_2_ < 0x100) * cStack_46c -
                 (0xff < uStack_f0._4_2_);
    bStack_471 = (uStack_f0._6_2_ != 0) * (uStack_f0._6_2_ < 0x100) * cStack_46a -
                 (0xff < uStack_f0._6_2_);
    cStack_470 = (local_488 != 0) * (local_488 < 0x100) * (char)local_488 - (0xff < local_488);
    cStack_46f = (uStack_486 != 0) * (uStack_486 < 0x100) * (char)uStack_486 - (0xff < uStack_486);
    cStack_46e = (uStack_484 != 0) * (uStack_484 < 0x100) * (char)uStack_484 - (0xff < uStack_484);
    bStack_46d = (uStack_482 != 0) * (uStack_482 < 0x100) * (char)uStack_482 - (0xff < uStack_482);
    cStack_46c = (uStack_480 != 0) * (uStack_480 < 0x100) * (char)uStack_480 - (0xff < uStack_480);
    bStack_46b = (uStack_47e != 0) * (uStack_47e < 0x100) * (char)uStack_47e - (0xff < uStack_47e);
    cStack_46a = (uStack_47c != 0) * (uStack_47c < 0x100) * (char)uStack_47c - (0xff < uStack_47c);
    bStack_469 = (uStack_47a != 0) * (uStack_47a < 0x100) * (char)uStack_47a - (0xff < uStack_47a);
    local_d8 = CONCAT17(bStack_471,
                        CONCAT16(cStack_472,
                                 CONCAT15(bStack_473,
                                          CONCAT14(cStack_474,
                                                   CONCAT13(bStack_475,
                                                            CONCAT12(cStack_476,
                                                                     CONCAT11(cStack_477,local_478))
                                                           )))));
    uStack_d0 = CONCAT17(bStack_469,
                         CONCAT16(cStack_46a,
                                  CONCAT15(bStack_46b,
                                           CONCAT14(cStack_46c,
                                                    CONCAT13(bStack_46d,
                                                             CONCAT12(cStack_46e,
                                                                      CONCAT11(cStack_46f,cStack_470
                                                                              )))))));
    local_c8 = uVar1;
    uStack_c0 = uVar2;
    local_e8 = *(undefined8 *)Mask[0][local_4c0];
    uStack_e0 = *(undefined8 *)(Mask[0][local_4c0] + 8);
    auVar10._8_8_ = uVar2;
    auVar10._0_8_ = uVar1;
    auVar9._8_8_ = uStack_d0;
    auVar9._0_8_ = local_d8;
    auVar16 = pblendvb(auVar10,auVar9,(undefined1  [16])Mask[0][local_4c0]);
    *(undefined1 (*) [16])(local_6e8 + (long)local_450 * 2) = auVar16;
    local_44c = in_R9D + local_44c;
    local_450 = local_450 + 1;
  }
  for (local_4c4 = local_450; local_4c4 < in_EDI; local_4c4 = local_4c4 + 1) {
    local_6e8[(long)local_4c4 * 2] = uVar1;
    local_6e8[(long)local_4c4 * 2 + 1] = uVar2;
  }
LAB_005437c6:
  for (local_6ec = 0; local_6ec < in_EDI; local_6ec = local_6ec + 1) {
    lVar12 = (long)local_6ec;
    local_8 = (undefined8 *)(in_RSI + in_RDX * lVar12);
    local_18 = local_6e8[lVar12 * 2];
    uStack_10 = local_6e8[lVar12 * 2 + 1];
    *local_8 = local_6e8[lVar12 * 2];
  }
  return;
}

Assistant:

static void dr_prediction_z1_8xN_sse4_1(int N, uint8_t *dst, ptrdiff_t stride,
                                        const uint8_t *above,
                                        int upsample_above, int dx) {
  __m128i dstvec[32];

  dr_prediction_z1_HxW_internal_sse4_1(8, N, dstvec, above, upsample_above, dx);
  for (int i = 0; i < N; i++) {
    _mm_storel_epi64((__m128i *)(dst + stride * i), dstvec[i]);
  }
}